

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::python::Generator::PrintServiceDescriptor
          (Generator *this,ServiceDescriptor *descriptor)

{
  int iVar1;
  int iVar2;
  string *psVar3;
  mapped_type *pmVar4;
  ServiceDescriptorProto *proto;
  mapped_type *pmVar5;
  Generator *pGVar6;
  int __c;
  int __c_00;
  ServiceDescriptor *in_RSI;
  char *__s;
  MethodDescriptor *method;
  int i;
  ServiceDescriptorProto sdp;
  char required_function_arguments [105];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  m;
  string options_string;
  string service_name;
  undefined4 in_stack_fffffffffffffa28;
  int in_stack_fffffffffffffa2c;
  ServiceDescriptorProto *in_stack_fffffffffffffa30;
  ServiceDescriptorProto *in_stack_fffffffffffffa50;
  string *in_stack_fffffffffffffa58;
  AlphaNum *in_stack_fffffffffffffa68;
  mapped_type *in_stack_fffffffffffffa70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa78;
  Printer *in_stack_fffffffffffffa80;
  Descriptor *in_stack_fffffffffffffa88;
  Printer *in_stack_fffffffffffffa90;
  string *in_stack_fffffffffffffaa0;
  Generator *in_stack_fffffffffffffaa8;
  ServiceDescriptor *in_stack_fffffffffffffaf0;
  Generator *in_stack_fffffffffffffaf8;
  Generator *this_00;
  allocator local_469;
  string local_468 [32];
  undefined1 local_448 [39];
  undefined1 local_421 [33];
  string local_400 [16];
  char *in_stack_fffffffffffffc10;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffc18;
  Printer *in_stack_fffffffffffffc20;
  string local_3d8 [32];
  string local_3b8 [39];
  allocator local_391;
  string local_390 [32];
  undefined1 local_370 [40];
  string local_348 [80];
  string local_2f8;
  allocator local_2d1;
  string local_2d0 [39];
  allocator local_2a9;
  string local_2a8 [32];
  MethodDescriptor *local_288;
  int local_27c;
  char local_238 [119];
  undefined1 local_1c1 [33];
  string local_1a0 [39];
  allocator local_179;
  string local_178 [80];
  string local_128 [39];
  allocator local_101;
  string local_100 [39];
  allocator local_d9;
  string local_d8 [39];
  undefined1 local_b1 [97];
  string local_50 [32];
  string local_30 [32];
  ServiceDescriptor *local_10;
  
  local_10 = in_RSI;
  io::Printer::Print<>(in_stack_fffffffffffffa80,(char *)in_stack_fffffffffffffa78);
  ModuleLevelServiceDescriptorName_abi_cxx11_(in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0);
  std::__cxx11::string::string(local_50);
  ServiceDescriptor::options(local_10);
  MessageLite::SerializeToString
            ((MessageLite *)in_stack_fffffffffffffa30,
             (string *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
  io::Printer::Print<char[13],std::__cxx11::string>
            (in_stack_fffffffffffffa90,(char *)in_stack_fffffffffffffa88,
             &in_stack_fffffffffffffa80->variable_delimiter_,in_stack_fffffffffffffa78);
  io::Printer::Indent((Printer *)0x4bfed9);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x4bfee8);
  psVar3 = ServiceDescriptor::name_abi_cxx11_(local_10);
  pGVar6 = (Generator *)local_b1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_b1 + 1),"name",(allocator *)pGVar6);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)in_stack_fffffffffffffa70,(key_type *)in_stack_fffffffffffffa68);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)psVar3);
  std::__cxx11::string::~string((string *)(local_b1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_b1);
  proto = (ServiceDescriptorProto *)ServiceDescriptor::full_name_abi_cxx11_(local_10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,"full_name",&local_d9);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)in_stack_fffffffffffffa70,(key_type *)in_stack_fffffffffffffa68);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)proto);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_100,"file",&local_101);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)in_stack_fffffffffffffa70,(key_type *)in_stack_fffffffffffffa68);
  __s = "DESCRIPTOR";
  std::__cxx11::string::operator=((string *)pmVar5,"DESCRIPTOR");
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  ServiceDescriptor::index(local_10,__s,__c);
  strings::AlphaNum::AlphaNum((AlphaNum *)in_stack_fffffffffffffa30,in_stack_fffffffffffffa2c);
  StrCat_abi_cxx11_(in_stack_fffffffffffffa68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_178,"index",&local_179);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)in_stack_fffffffffffffa70,(key_type *)in_stack_fffffffffffffa68);
  std::__cxx11::string::operator=((string *)pmVar5,local_128);
  std::__cxx11::string::~string(local_178);
  std::allocator<char>::~allocator((allocator<char> *)&local_179);
  std::__cxx11::string::~string(local_128);
  OptionsValue(in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
  this_00 = (Generator *)local_1c1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_1c1 + 1),"options_value",(allocator *)this_00);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)in_stack_fffffffffffffa70,(key_type *)in_stack_fffffffffffffa68);
  std::__cxx11::string::operator=((string *)pmVar5,local_1a0);
  std::__cxx11::string::~string((string *)(local_1c1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_1c1);
  std::__cxx11::string::~string(local_1a0);
  builtin_strncpy(local_238 + 0x60,"value$,\n",9);
  builtin_strncpy(local_238 + 0x50,"ptions=$options_",0x10);
  builtin_strncpy(local_238 + 0x40,"x$,\nserialized_o",0x10);
  builtin_strncpy(local_238 + 0x30,"le$,\nindex=$inde",0x10);
  builtin_strncpy(local_238 + 0x20,"name$\',\nfile=$fi",0x10);
  builtin_strncpy(local_238 + 0x10,"ull_name=\'$full_",0x10);
  builtin_strncpy(local_238,"name=\'$name$\',\nf",0x10);
  io::Printer::Print(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,in_stack_fffffffffffffc10);
  ServiceDescriptorProto::ServiceDescriptorProto(in_stack_fffffffffffffa50);
  PrintSerializedPbInterval<google::protobuf::ServiceDescriptor,google::protobuf::ServiceDescriptorProto>
            (pGVar6,(ServiceDescriptor *)pmVar4,proto);
  io::Printer::Print<>(in_stack_fffffffffffffa80,(char *)in_stack_fffffffffffffa78);
  local_27c = 0;
  while( true ) {
    iVar1 = local_27c;
    iVar2 = ServiceDescriptor::method_count(local_10);
    if (iVar2 <= iVar1) break;
    local_288 = ServiceDescriptor::method(local_10,local_27c);
    MethodDescriptor::options(local_288);
    MessageLite::SerializeToString
              ((MessageLite *)in_stack_fffffffffffffa30,
               (string *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::clear((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)0x4c03ae);
    psVar3 = MethodDescriptor::name_abi_cxx11_(local_288);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2a8,"name",&local_2a9);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)in_stack_fffffffffffffa70,(key_type *)in_stack_fffffffffffffa68);
    std::__cxx11::string::operator=((string *)pmVar4,(string *)psVar3);
    std::__cxx11::string::~string(local_2a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
    psVar3 = MethodDescriptor::full_name_abi_cxx11_(local_288);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2d0,"full_name",&local_2d1);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)in_stack_fffffffffffffa70,(key_type *)in_stack_fffffffffffffa68);
    std::__cxx11::string::operator=((string *)pmVar4,(string *)psVar3);
    std::__cxx11::string::~string(local_2d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
    MethodDescriptor::index(local_288,(char *)psVar3,__c_00);
    strings::AlphaNum::AlphaNum((AlphaNum *)in_stack_fffffffffffffa30,in_stack_fffffffffffffa2c);
    StrCat_abi_cxx11_(in_stack_fffffffffffffa68);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_348,"index",(allocator *)(local_370 + 0x27));
    pGVar6 = (Generator *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)in_stack_fffffffffffffa70,(key_type *)in_stack_fffffffffffffa68);
    psVar3 = &local_2f8;
    std::__cxx11::string::operator=((string *)pGVar6,(string *)psVar3);
    std::__cxx11::string::~string(local_348);
    std::allocator<char>::~allocator((allocator<char> *)(local_370 + 0x27));
    std::__cxx11::string::~string((string *)psVar3);
    CEscape(in_stack_fffffffffffffa58);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_390,"serialized_options",&local_391);
    in_stack_fffffffffffffa90 =
         (Printer *)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)in_stack_fffffffffffffa70,(key_type *)in_stack_fffffffffffffa68);
    in_stack_fffffffffffffa80 = (Printer *)local_370;
    std::__cxx11::string::operator=
              ((string *)in_stack_fffffffffffffa90,(string *)in_stack_fffffffffffffa80);
    std::__cxx11::string::~string(local_390);
    std::allocator<char>::~allocator((allocator<char> *)&local_391);
    std::__cxx11::string::~string((string *)in_stack_fffffffffffffa80);
    in_stack_fffffffffffffa88 = MethodDescriptor::input_type((MethodDescriptor *)0x4c065d);
    ModuleLevelDescriptorName<google::protobuf::Descriptor>(this_00,(Descriptor *)pmVar5);
    in_stack_fffffffffffffa78 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         &stack0xfffffffffffffc27;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3d8,"input_type",(allocator *)in_stack_fffffffffffffa78);
    in_stack_fffffffffffffa70 =
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)in_stack_fffffffffffffa70,(key_type *)in_stack_fffffffffffffa68);
    std::__cxx11::string::operator=((string *)in_stack_fffffffffffffa70,local_3b8);
    std::__cxx11::string::~string(local_3d8);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffc27);
    std::__cxx11::string::~string(local_3b8);
    in_stack_fffffffffffffa68 =
         (AlphaNum *)MethodDescriptor::output_type((MethodDescriptor *)0x4c0711);
    ModuleLevelDescriptorName<google::protobuf::Descriptor>(this_00,(Descriptor *)pmVar5);
    in_stack_fffffffffffffa58 = (string *)local_421;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_421 + 1),"output_type",(allocator *)in_stack_fffffffffffffa58);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)in_stack_fffffffffffffa70,(key_type *)in_stack_fffffffffffffa68);
    std::__cxx11::string::operator=((string *)pmVar4,local_400);
    std::__cxx11::string::~string((string *)(local_421 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_421);
    std::__cxx11::string::~string(local_400);
    OptionsValue(pGVar6,psVar3);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_468,"options_value",&local_469);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)in_stack_fffffffffffffa70,(key_type *)in_stack_fffffffffffffa68);
    in_stack_fffffffffffffa30 = (ServiceDescriptorProto *)local_448;
    std::__cxx11::string::operator=((string *)pmVar4,(string *)in_stack_fffffffffffffa30);
    std::__cxx11::string::~string(local_468);
    std::allocator<char>::~allocator((allocator<char> *)&local_469);
    std::__cxx11::string::~string((string *)in_stack_fffffffffffffa30);
    io::Printer::Print<>(in_stack_fffffffffffffa80,(char *)in_stack_fffffffffffffa78);
    io::Printer::Indent((Printer *)0x4c0886);
    io::Printer::Print(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,in_stack_fffffffffffffc10
                      );
    io::Printer::Outdent(in_stack_fffffffffffffa90);
    io::Printer::Print<>(in_stack_fffffffffffffa80,(char *)in_stack_fffffffffffffa78);
    local_27c = local_27c + 1;
  }
  io::Printer::Outdent(in_stack_fffffffffffffa90);
  io::Printer::Print<>(in_stack_fffffffffffffa80,(char *)in_stack_fffffffffffffa78);
  io::Printer::Print<char[5],std::__cxx11::string>
            (in_stack_fffffffffffffa90,(char *)in_stack_fffffffffffffa88,
             &in_stack_fffffffffffffa80->variable_delimiter_,in_stack_fffffffffffffa78);
  io::Printer::Print<>(in_stack_fffffffffffffa80,(char *)in_stack_fffffffffffffa78);
  ServiceDescriptorProto::~ServiceDescriptorProto(in_stack_fffffffffffffa30);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)0x4c0d8b);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void Generator::PrintServiceDescriptor(
    const ServiceDescriptor& descriptor) const {
  printer_->Print("\n");
  std::string service_name = ModuleLevelServiceDescriptorName(descriptor);
  std::string options_string;
  descriptor.options().SerializeToString(&options_string);

  printer_->Print("$service_name$ = _descriptor.ServiceDescriptor(\n",
                  "service_name", service_name);
  printer_->Indent();
  std::map<std::string, std::string> m;
  m["name"] = descriptor.name();
  m["full_name"] = descriptor.full_name();
  m["file"] = kDescriptorKey;
  m["index"] = StrCat(descriptor.index());
  m["options_value"] = OptionsValue(options_string);
  const char required_function_arguments[] =
      "name='$name$',\n"
      "full_name='$full_name$',\n"
      "file=$file$,\n"
      "index=$index$,\n"
      "serialized_options=$options_value$,\n";
  printer_->Print(m, required_function_arguments);

  ServiceDescriptorProto sdp;
  PrintSerializedPbInterval(descriptor, sdp);

  printer_->Print("methods=[\n");
  for (int i = 0; i < descriptor.method_count(); ++i) {
    const MethodDescriptor* method = descriptor.method(i);
    method->options().SerializeToString(&options_string);

    m.clear();
    m["name"] = method->name();
    m["full_name"] = method->full_name();
    m["index"] = StrCat(method->index());
    m["serialized_options"] = CEscape(options_string);
    m["input_type"] = ModuleLevelDescriptorName(*(method->input_type()));
    m["output_type"] = ModuleLevelDescriptorName(*(method->output_type()));
    m["options_value"] = OptionsValue(options_string);
    printer_->Print("_descriptor.MethodDescriptor(\n");
    printer_->Indent();
    printer_->Print(m,
                    "name='$name$',\n"
                    "full_name='$full_name$',\n"
                    "index=$index$,\n"
                    "containing_service=None,\n"
                    "input_type=$input_type$,\n"
                    "output_type=$output_type$,\n"
                    "serialized_options=$options_value$,\n");
    printer_->Outdent();
    printer_->Print("),\n");
  }

  printer_->Outdent();
  printer_->Print("])\n");
  printer_->Print("_sym_db.RegisterServiceDescriptor($name$)\n", "name",
                  service_name);
  printer_->Print("\n");
}